

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 Decompress_DPCM_8(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,
                       PCM_CMP_INF *cmpParams)

{
  byte bVar1;
  byte bVar2;
  UINT8 *pUVar3;
  ushort uVar4;
  undefined1 auVar5 [12];
  FUINT8 FVar6;
  ushort uVar7;
  uint uVar8;
  short local_72;
  ushort local_6e;
  UINT16 outMask;
  FUINT8 outBit;
  FUINT8 bitMask;
  FUINT8 inValB;
  FUINT8 bitReadVal;
  FUINT8 bitsToRead;
  UINT8 *ent1B;
  FUINT8 outShift;
  FUINT8 inShift;
  FUINT8 outVal;
  FUINT8 inVal;
  UINT8 *outDataEnd;
  UINT8 *pUStack_48;
  UINT32 outLenMax;
  UINT8 *outPos;
  UINT8 *inPos;
  FUINT8 bitsCmp;
  PCM_CMP_INF *cmpParams_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  UINT8 *outData_local;
  UINT32 outLen_local;
  
  bVar1 = cmpParams->bitsCmp;
  pUVar3 = (cmpParams->comprTbl->values).d8;
  if (cmpParams->comprTbl->valueCount == 0) {
    outData_local._7_1_ = '\x10';
  }
  else if ((cmpParams->bitsDec == cmpParams->comprTbl->bitsDec) &&
          (cmpParams->bitsCmp == cmpParams->comprTbl->bitsCmp)) {
    bVar2 = cmpParams->bitsDec;
    ent1B._2_2_ = 0;
    auVar5._4_8_ = 0;
    auVar5._0_4_ = inLen;
    uVar8 = SUB124((auVar5 << 3) / ZEXT112(cmpParams->bitsCmp),0);
    outData_local._0_4_ = outLen;
    if (uVar8 < outLen) {
      outData_local._0_4_ = uVar8;
    }
    ent1B._4_2_ = cmpParams->baseVal;
    outPos = inData;
    for (pUStack_48 = outData; pUStack_48 < outData + (UINT32)outData_local;
        pUStack_48 = pUStack_48 + 1) {
      local_72 = 0;
      ent1B._6_2_ = 0;
      outBit = (ushort)bVar1;
      while (outBit != 0) {
        FVar6 = outBit;
        if (7 < outBit) {
          FVar6 = 8;
        }
        outBit = outBit - FVar6;
        uVar7 = (short)(1 << ((byte)FVar6 & 0x1f)) - 1;
        ent1B._2_2_ = ent1B._2_2_ + FVar6;
        uVar4 = (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8);
        local_6e = uVar4 & uVar7;
        if (7 < ent1B._2_2_) {
          ent1B._2_2_ = ent1B._2_2_ - 8;
          outPos = outPos + 1;
          if (ent1B._2_2_ != 0) {
            local_6e = uVar7 & (uVar4 | (ushort)(((uint)*outPos << ((byte)ent1B._2_2_ & 0x1f)) >> 8)
                               );
          }
        }
        ent1B._6_2_ = ent1B._6_2_ | local_6e << ((byte)local_72 & 0x1f);
        local_72 = local_72 + FVar6;
      }
      ent1B._4_2_ = ent1B._4_2_ + pUVar3[ent1B._6_2_] & (short)(1 << (bVar2 & 0x1f)) - 1U;
      *pUStack_48 = (UINT8)ent1B._4_2_;
    }
    outData_local._7_1_ = '\0';
  }
  else {
    outData_local._7_1_ = '\x11';
  }
  return outData_local._7_1_;
}

Assistant:

static UINT8 Decompress_DPCM_8(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmpParams)
{
	FUINT8 bitsCmp;
	const UINT8* inPos;
	UINT8* outPos;
	UINT32 outLenMax;
	const UINT8* outDataEnd;
	FUINT8 inVal;
	FUINT8 outVal;
	FUINT8 inShift;
	FUINT8 outShift;
	const UINT8* ent1B;
	
	// ReadBits Variables
	FUINT8 bitsToRead;
	FUINT8 bitReadVal;
	FUINT8 inValB;
	FUINT8 bitMask;
	FUINT8 outBit;
	
	// Variables for DPCM
	UINT16 outMask;
	
	// --- Delta-PCM --- (8 bit output)
	bitsCmp = cmpParams->bitsCmp;
	ent1B = cmpParams->comprTbl->values.d8;
	if (! cmpParams->comprTbl->valueCount)
	{
		return 0x10;	// Error: no table loaded
	}
	else if (cmpParams->bitsDec != cmpParams->comprTbl->bitsDec ||
		cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)
	{
		return 0x11;	// Data block and loaded value table incompatible
	}
	
	outMask = (1 << cmpParams->bitsDec) - 1;
	inShift = 0;
	outShift = cmpParams->bitsDec - cmpParams->bitsCmp;
	outLenMax = MUL_DIV(inLen, 8, cmpParams->bitsCmp);
	if (outLen > outLenMax)
		outLen = outLenMax;
	outDataEnd = outData + outLen;
	
	outVal = (FUINT8)cmpParams->baseVal;
	for (inPos = inData, outPos = outData; outPos < outDataEnd; outPos += 0x01)
	{
		READ_BITS(inPos, inVal, inShift, bitsCmp);
		
		outVal += ent1B[inVal];
		outVal &= outMask;
		*outPos = (UINT8)outVal;
	}
	
	return 0x00;
}